

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_InvalidFieldNonMessageWithMessageEncoding_Test::
~FeaturesTest_InvalidFieldNonMessageWithMessageEncoding_Test
          (FeaturesTest_InvalidFieldNonMessageWithMessageEncoding_Test *this)

{
  FeaturesTest_InvalidFieldNonMessageWithMessageEncoding_Test *this_local;
  
  ~FeaturesTest_InvalidFieldNonMessageWithMessageEncoding_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFieldNonMessageWithMessageEncoding) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        message_type {
          name: "Foo"
          field {
            name: "bar"
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_INT64
            options { features { message_encoding: DELIMITED } }
          }
        }
      )pb",
      "foo.proto: Foo.bar: NAME: Only message fields can specify message "
      "encoding.\n");
}